

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O3

bool __thiscall UnifiedRegex::CharTrie::IsDepthOne(CharTrie *this)

{
  ulong uVar1;
  int *piVar2;
  ulong uVar3;
  
  if (this->isAccepting != false) {
    return false;
  }
  uVar1 = (ulong)this->count;
  if (0 < (long)uVar1) {
    piVar2 = &(this->children->node).count;
    uVar3 = 0;
    while( true ) {
      if (*(bool *)(piVar2 + -2) != true) {
        return false;
      }
      if (*piVar2 != 0) break;
      uVar3 = uVar3 + 1;
      piVar2 = piVar2 + 8;
      if (uVar1 == uVar3) {
        return uVar1 <= uVar3;
      }
    }
    return false;
  }
  return true;
}

Assistant:

bool CharTrie::IsDepthOne() const
    {
        if (isAccepting)
            return 0;
        for (int i = 0; i < count; i++)
        {
            if (!children[i].node.IsDepthZero())
                return false;
        }
        return true;
    }